

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int cmdtog(errcxdef *ec,int prv,char *argp,int ofs,_func_void_errcxdef_ptr *usagefn)

{
  char cVar1;
  uint uVar2;
  
  cVar1 = argp[(long)ofs + 1];
  if (cVar1 == '\0') {
    uVar2 = (uint)(prv == 0);
  }
  else if (cVar1 == '+') {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    if ((cVar1 != '-') && (usagefn != (_func_void_errcxdef_ptr *)0x0)) {
      (*usagefn)(ec);
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

int cmdtog(errcxdef *ec, int prv, char *argp, int ofs,
           void (*usagefn)(errcxdef *))
{
    switch(argp[ofs + 1])
    {
    case '+':
        return(TRUE);
        
    case '-':
        return(FALSE);
        
    case '\0':
        return(!prv);
        
    default:
        /* invalid - display usage if we have a callback for it */
        if (usagefn != 0)
            (*usagefn)(ec);
        NOTREACHEDV(int);
        return 0;
    }
}